

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O0

bool __thiscall ConfigReader::parsePad(ConfigReader *this)

{
  bool bVar1;
  string *psVar2;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_18d;
  allocator<char> local_18c;
  allocator<char> local_18b;
  allocator<char> local_18a;
  allocator<char> local_189;
  string *local_188;
  undefined1 local_180 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL> items;
  string local_f8;
  undefined4 local_d8;
  allocator<char> local_d1;
  string local_d0;
  token_t local_a0;
  byte local_99;
  token_t tok;
  bool flipped;
  string cellname;
  string location;
  string instance;
  string tokstr;
  ConfigReader *this_local;
  
  std::__cxx11::string::string((string *)(instance.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(location.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(cellname.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&tok);
  local_99 = 0;
  local_a0 = tokenize(this,(string *)(location.field_2._M_local_buf + 8));
  if (local_a0 == TOK_IDENT) {
    local_a0 = tokenize(this,(string *)((long)&cellname.field_2 + 8));
    if (local_a0 == TOK_IDENT) {
      local_18d = 1;
      local_188 = (string *)local_180;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_180,"N",&local_189);
      psVar2 = (string *)(items._M_elems[0].field_2._M_local_buf + 8);
      local_188 = psVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(psVar2,"E",&local_18a);
      psVar2 = (string *)(items._M_elems[1].field_2._M_local_buf + 8);
      local_188 = psVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(psVar2,"S",&local_18b);
      psVar2 = (string *)(items._M_elems[2].field_2._M_local_buf + 8);
      local_188 = psVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(psVar2,"W",&local_18c);
      local_18d = 0;
      std::allocator<char>::~allocator(&local_18c);
      std::allocator<char>::~allocator(&local_18b);
      std::allocator<char>::~allocator(&local_18a);
      std::allocator<char>::~allocator(&local_189);
      bVar1 = inArray(this,(string *)((long)&cellname.field_2 + 8),
                      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                       *)local_180);
      if (bVar1) {
        local_a0 = tokenize(this,(string *)&tok);
        if ((local_a0 == TOK_IDENT) &&
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&tok,"FLIP"), bVar1)) {
          local_99 = 1;
          local_a0 = tokenize(this,(string *)&tok);
        }
        if (local_a0 == TOK_IDENT) {
          local_a0 = tokenize(this,(string *)((long)&instance.field_2 + 8));
          if (local_a0 == TOK_SEMICOL) {
            this->m_padCount = this->m_padCount + 1;
            (*this->_vptr_ConfigReader[3])
                      (this,(undefined1 *)((long)&location.field_2 + 8),
                       (undefined1 *)((long)&cellname.field_2 + 8),&tok,(ulong)(local_99 & 1));
            this_local._7_1_ = true;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_200,"Expected ;\n",&local_201);
            error(this,&local_200);
            std::__cxx11::string::~string((string *)&local_200);
            std::allocator<char>::~allocator(&local_201);
            this_local._7_1_ = false;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"Expected a cell name\n",&local_1d9);
          error(this,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
          this_local._7_1_ = false;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"Expected a pad location to be one of N/E/S/W\n",&local_1b1)
        ;
        error(this,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::allocator<char>::~allocator(&local_1b1);
        this_local._7_1_ = false;
      }
      local_d8 = 1;
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)local_180);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Expected a location\n",
                 (allocator<char> *)(items._M_elems[3].field_2._M_local_buf + 0xf));
      error(this,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator
                ((allocator<char> *)(items._M_elems[3].field_2._M_local_buf + 0xf));
      this_local._7_1_ = false;
      local_d8 = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Expected an instance name\n",&local_d1);
    error(this,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    this_local._7_1_ = false;
    local_d8 = 1;
  }
  std::__cxx11::string::~string((string *)&tok);
  std::__cxx11::string::~string((string *)(cellname.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(location.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(instance.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool ConfigReader::parsePad()
{
    // PAD: instance location cellname
    std::string tokstr;
    std::string instance;
    std::string location;
    std::string cellname;
    bool flipped = false;

    // instance name
    ConfigReader::token_t tok = tokenize(instance);
    if (tok != TOK_IDENT)
    {
        error("Expected an instance name\n");
        return false;
    }

    // location name
    tok = tokenize(location);
    if (tok != TOK_IDENT)
    {
        error("Expected a location\n");
        return false;
    }

    // PADs can only be on North, South, East or West
    std::array<std::string, 4> items = {"N","E","S","W"};
    if (!inArray(location, items))
    {
        error("Expected a pad location to be one of N/E/S/W\n");
        return false;
    }

    // parse optional 'FLIP' argument for flipped cells
    tok = tokenize(cellname);
    if ((tok == TOK_IDENT) && (cellname == "FLIP"))
    {
        flipped = true;
        tok = tokenize(cellname);
    }

    // cell name    
    if (tok != TOK_IDENT)
    {
        error("Expected a cell name\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    m_padCount++;
    onPad(instance,location,cellname,flipped);

    return true;
}